

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aixlog.hpp
# Opt level: O2

ostream * AixLog::operator<<(ostream *os,Timestamp *timestamp)

{
  int iVar1;
  ostream *poVar2;
  undefined4 extraout_var;
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  poVar2 = (ostream *)&std::clog;
  if (*(long *)(std::__cxx11::stringstream::stringstream + *(long *)(std::clog + -0x18)) != 0) {
    poVar2 = (ostream *)
             __dynamic_cast(*(long *)(std::__cxx11::stringstream::stringstream +
                                     *(long *)(std::clog + -0x18)),&std::streambuf::typeinfo,
                            &Log::typeinfo,0);
    if (poVar2 != (ostream *)0x0) {
      std::recursive_mutex::lock((recursive_mutex *)&((pthread_mutex_t *)(poVar2 + 0x148))->__data);
      poVar2[0x120] = os[0x10];
      *(undefined8 *)(poVar2 + 0x118) = *(undefined8 *)(os + 8);
      iVar1 = pthread_mutex_unlock((pthread_mutex_t *)(poVar2 + 0x148));
      return (ostream *)CONCAT44(extraout_var,iVar1);
    }
  }
  if (os[0x10] == (ostream)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"%Y-%m-%d %H-%M-%S.#ms",&local_59);
    Timestamp::to_string(&local_58,(Timestamp *)os,&local_38);
    std::operator<<((ostream *)&std::clog,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    poVar2 = (ostream *)std::__cxx11::string::~string((string *)&local_38);
  }
  return poVar2;
}

Assistant:

static std::ostream& operator<<(std::ostream& os, const Timestamp& timestamp) {
  Log* log = dynamic_cast<Log*>(os.rdbuf());
  if (log != nullptr) {
    std::lock_guard<std::recursive_mutex> lock(log->mutex_);
    log->metadata_.timestamp = timestamp;
  } else if (timestamp) {
    os << timestamp.to_string();
  }
  return os;
}